

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntryStream.cpp
# Opt level: O2

Range __thiscall binlog::IstreamEntryStream::nextEntryPayload(IstreamEntryStream *this)

{
  istream *piVar1;
  pointer pcVar2;
  runtime_error *prVar3;
  pointer pcVar4;
  Range RVar5;
  uint32_t size;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::istream::read((char *)this->_input,(long)&size);
  piVar1 = this->_input;
  if (*(FILE **)(piVar1 + 8) == (FILE *)0x0) {
    pcVar2 = (pointer)0x0;
    pcVar4 = (pointer)0x0;
  }
  else {
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
      rewind(this,*(FILE **)(piVar1 + 8));
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_98,*(long *)(this->_input + 8));
      std::operator+(&local_78,"Failed to read entry size from istream, only got ",&local_98);
      std::operator+(&local_58,&local_78," bytes, expected ");
      std::__cxx11::to_string(&local_b8,4);
      std::operator+(&local_38,&local_58,&local_b8);
      std::runtime_error::runtime_error(prVar3,(string *)&local_38);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::vector<char,_std::allocator<char>_>::resize(&this->_buffer,(ulong)size);
    std::istream::read((char *)this->_input,
                       (long)(this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl
                             .super__Vector_impl_data._M_start);
    piVar1 = this->_input;
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) {
      rewind(this,(FILE *)(*(long *)(piVar1 + 8) + 4));
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_98,*(long *)(this->_input + 8));
      std::operator+(&local_78,"Failed to read entry payload from istream, only got ",&local_98);
      std::operator+(&local_58,&local_78," bytes, expected ");
      std::__cxx11::to_string(&local_b8,size);
      std::operator+(&local_38,&local_58,&local_b8);
      std::runtime_error::runtime_error(prVar3,(string *)&local_38);
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = (this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar4 = (this->_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  RVar5._end = pcVar4;
  RVar5._begin = pcVar2;
  return RVar5;
}

Assistant:

Range IstreamEntryStream::nextEntryPayload()
{
  std::uint32_t size;
  _input.read(reinterpret_cast<char*>(&size), sizeof(size));
  if (_input.gcount() == 0)
  {
    return {}; // eof
  }

  if (! _input) // found some bytes, but not enough
  {
    rewind(_input.gcount());
    throw std::runtime_error("Failed to read entry size from istream, only got "
      + std::to_string(_input.gcount()) + " bytes, expected " + std::to_string(sizeof(size)));
  }

  // TODO(benedek) protect agains bad alloc by limiting size?
  _buffer.resize(size);
  _input.read(_buffer.data(), std::streamsize(size));
  if (! _input) // payload is truncated
  {
    rewind(std::streamsize(sizeof(size)) + _input.gcount());
    throw std::runtime_error("Failed to read entry payload from istream, only got "
      + std::to_string(_input.gcount()) + " bytes, expected " + std::to_string(size));
  }

  return Range{_buffer.data(), _buffer.size()};
}